

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void crnlib::vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  undefined4 *puVar1;
  long lVar2;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *pSrc;
  
  if (num != 0) {
    lVar2 = 0;
    do {
      puVar1 = (undefined4 *)((long)pSrc_void + lVar2);
      *(undefined4 *)((long)pDst_void + lVar2) = *puVar1;
      *(undefined4 *)((long)pDst_void + lVar2 + 4) = puVar1[1];
      *(undefined4 *)((long)pDst_void + lVar2 + 8) = puVar1[2];
      lVar2 = lVar2 + 0xc;
    } while (puVar1 + 3 != (undefined4 *)((long)pSrc_void + (ulong)num * 0xc));
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }